

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

node_t_conflict initializer_list(c2m_ctx_t c2m_ctx,int no_err_p)

{
  parse_ctx *ppVar1;
  token_t ptVar2;
  undefined8 uVar3;
  int iVar4;
  node_t_conflict pnVar5;
  node_t_conflict op;
  char *expected_name;
  code *pcVar6;
  bool bVar7;
  node_t_conflict r;
  parse_ctx *local_40;
  node_t_conflict local_38;
  
  ppVar1 = c2m_ctx->parse_ctx;
  local_38 = new_node(c2m_ctx,N_LIST);
  ptVar2 = ppVar1->curr_token;
  local_40 = ppVar1;
  if (*(short *)ptVar2 == 0x7d) {
    uVar3._0_4_ = (ptVar2->pos).lno;
    uVar3._4_4_ = (ptVar2->pos).ln_pos;
    pcVar6 = error;
    if (c2m_ctx->options->pedantic_p == 0) {
      pcVar6 = warning;
    }
    (*pcVar6)(c2m_ctx,(ptVar2->pos).fname,uVar3,"empty initializer list");
    return local_38;
  }
LAB_00165219:
  pnVar5 = new_node(c2m_ctx,N_LIST);
  bVar7 = false;
  do {
    iVar4 = match(c2m_ctx,0x5b,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
    if (iVar4 == 0) {
      iVar4 = match(c2m_ctx,0x2e,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
      if (iVar4 == 0) break;
      iVar4 = match(c2m_ctx,0x103,(pos_t *)0x0,(node_code_t *)0x0,&r);
      if (iVar4 == 0) {
        if (local_40->record_level != 0) goto LAB_00165399;
        expected_name = "identifier";
        goto LAB_00165394;
      }
      r = new_node1(c2m_ctx,N_FIELD_ID,r);
    }
    else {
      r = cond_expr(c2m_ctx,no_err_p);
      if (r == &err_struct) goto LAB_00165399;
      iVar4 = match(c2m_ctx,0x5d,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
      if (iVar4 == 0) {
        if (local_40->record_level != 0) goto LAB_00165399;
        iVar4 = 0x5d;
        goto LAB_0016536f;
      }
    }
    op_append(c2m_ctx,pnVar5,r);
    bVar7 = true;
  } while( true );
  if ((bVar7) &&
     (iVar4 = match(c2m_ctx,0x3d,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0), iVar4 == 0
     )) {
    if (local_40->record_level == 0) {
      iVar4 = 0x3d;
LAB_0016536f:
      expected_name = get_token_name(c2m_ctx,iVar4);
LAB_00165394:
      syntax_error(c2m_ctx,expected_name);
    }
  }
  else {
    r = initializer(c2m_ctx,no_err_p);
    if (r != &err_struct) {
      op = new_node2(c2m_ctx,N_INIT,pnVar5,r);
      pnVar5 = local_38;
      op_append(c2m_ctx,local_38,op);
      iVar4 = match(c2m_ctx,0x2c,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
      if (iVar4 == 0) {
        return pnVar5;
      }
      if (*(short *)local_40->curr_token == 0x7d) {
        return pnVar5;
      }
      goto LAB_00165219;
    }
  }
LAB_00165399:
  return &err_struct;
}

Assistant:

D (initializer_list) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;
  node_t list, list2, r;
  int first_p;

  list = new_node (c2m_ctx, N_LIST);
  if (C ('}')) {
    (c2m_options->pedantic_p ? error : warning) (c2m_ctx, curr_token->pos,
                                                 "empty initializer list");
    return list;
  }
  for (;;) { /* designation */
    list2 = new_node (c2m_ctx, N_LIST);
    for (first_p = TRUE;; first_p = FALSE) { /* designator-list, designator */
      if (M ('[')) {
        P (const_expr);
        PT (']');
      } else if (M ('.')) {
        PTN (T_ID);
        r = new_node1 (c2m_ctx, N_FIELD_ID, r);
      } else
        break;
      op_append (c2m_ctx, list2, r);
    }
    if (!first_p) {
      PT ('=');
    }
    P (initializer);
    op_append (c2m_ctx, list, new_node2 (c2m_ctx, N_INIT, list2, r));
    if (!M (',')) break;
    if (C ('}')) break;
  }
  return list;
}